

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

int absl::lts_20250127::base_internal::Random(uint32_t *state)

{
  undefined4 local_18;
  undefined4 local_14;
  int result;
  uint32_t r;
  uint32_t *state_local;
  
  local_14 = *state;
  local_18 = 1;
  while (local_14 = local_14 * 0x41c64e6d + 0x3039, (local_14 >> 0x1e & 1) == 0) {
    local_18 = local_18 + 1;
  }
  *state = local_14;
  return local_18;
}

Assistant:

static int Random(uint32_t *state) {
  uint32_t r = *state;
  int result = 1;
  while ((((r = r * 1103515245 + 12345) >> 30) & 1) == 0) {
    result++;
  }
  *state = r;
  return result;
}